

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromDecimalString
          (IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  byte bVar1;
  fltSemantics *pfVar2;
  WordType *pWVar3;
  uint uVar4;
  opStatus oVar5;
  byte *pbVar6;
  WordType *dst;
  int iVar7;
  byte *pbVar8;
  WordType carry;
  byte *pbVar9;
  ulong multiplier;
  int iVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  Significand *dst_00;
  uint uVar14;
  byte *begin;
  byte *end;
  bool bVar15;
  byte *local_50;
  uint local_48;
  roundingMode local_44;
  WordType *local_40;
  IEEEFloat *local_38;
  
  begin = (byte *)str.Data;
  end = begin + str.Length;
  local_50 = end;
  pbVar6 = (byte *)skipLeadingZeroesAndAnyDot((iterator)begin,(iterator)end,(iterator *)&local_50);
  pbVar13 = pbVar6;
  pbVar9 = local_50;
  pbVar8 = pbVar6;
  if (pbVar6 != end) {
    do {
      pbVar8 = pbVar13;
      if (*pbVar13 == 0x2e) {
        if (pbVar9 != end) {
          __assert_fail("dot == end && \"String contains multiple dots\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x155,
                        "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                       );
        }
        pbVar8 = pbVar13 + 1;
        pbVar9 = pbVar13;
        local_50 = pbVar13;
        if (pbVar8 == end) break;
      }
      if (((int)(char)*pbVar8 - 0x3aU < 0xfffffff6) ||
         (pbVar8 = pbVar8 + 1, pbVar13 = pbVar8, pbVar8 == end)) break;
    } while( true );
  }
  iVar7 = 0;
  local_48 = 0;
  if (pbVar8 != end) {
    if ((*pbVar8 | 0x20) != 0x65) {
      __assert_fail("(*p == \'e\' || *p == \'E\') && \"Invalid character in significand\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x15f,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if (pbVar8 == begin) {
      __assert_fail("p != begin && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x160,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if ((long)pbVar8 - (long)begin == 1 && local_50 != end) {
      __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x161,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    pbVar13 = pbVar8 + 1;
    if (pbVar13 == end) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xca,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    bVar1 = *pbVar13;
    if (((bVar1 == 0x2d) || (bVar1 == 0x2b)) && (pbVar13 = pbVar8 + 2, pbVar13 == end)) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xcf,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    uVar14 = (int)(char)*pbVar13 - 0x30;
    if (9 < uVar14) {
      __assert_fail("absExponent < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xd3,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    do {
      pbVar13 = pbVar13 + 1;
      if (pbVar13 == end) goto LAB_001683d9;
      if (9 < (int)(char)*pbVar13 - 0x30U) {
        __assert_fail("value < 10U && \"Invalid character in exponent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xd9,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
      }
      bVar15 = uVar14 < 24000;
      uVar14 = ((int)(char)*pbVar13 - 0x30U) + uVar14 * 10;
    } while (bVar15);
    uVar14 = 24000;
    pbVar13 = end;
LAB_001683d9:
    if (pbVar13 != end) {
      __assert_fail("p == end && \"Invalid exponent in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xe4,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    local_48 = -uVar14;
    if (bVar1 != 0x2d) {
      local_48 = uVar14;
    }
    if (local_50 == end) {
      local_50 = pbVar8;
    }
  }
  if (pbVar8 != pbVar6) {
    pbVar13 = pbVar8;
    if (pbVar8 != begin) {
      do {
        pbVar13 = pbVar13 + -1;
        pbVar8 = begin;
        if (pbVar13 == begin) break;
      } while ((*pbVar13 == 0x30) || (pbVar8 = pbVar13, *pbVar13 == 0x2e));
    }
    local_48 = local_48 +
               (int)(short)(((short)local_50 - (short)pbVar8) - (ushort)(pbVar8 < local_50));
    iVar7 = (int)(short)(((short)pbVar8 - (short)pbVar6) -
                        (ushort)(pbVar6 < local_50 && local_50 < pbVar8)) + local_48;
  }
  if ((pbVar6 == end) || ((int)(char)*pbVar6 - 0x3aU < 0xfffffff6)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    return opOK;
  }
  if (iVar7 < 0xc78d) {
    if (-0xc78b < iVar7) {
      iVar10 = iVar7 * 0x7042 + 0x7042;
      pfVar2 = this->semantics;
      iVar11 = (int)pfVar2->minExponent - pfVar2->precision;
      iVar12 = iVar11 * 0x21cb;
      if (iVar10 != iVar12 && SBORROW4(iVar10,iVar12) == iVar10 + iVar11 * -0x21cb < 0) {
        iVar7 = iVar7 * 0xa437 + -0xa437;
        if (SBORROW4(iVar7,pfVar2->maxExponent * 0x316f) !=
            iVar7 + pfVar2->maxExponent * -0x316f < 0) {
          local_44 = rounding_mode;
          local_38 = this;
          dst = (WordType *)
                operator_new__((ulong)(((((int)pbVar8 - (int)pbVar6) * 0xc4 + 0xc4U) / 0x3b + 0x40
                                       >> 6) * 8 + 8));
          uVar14 = 0;
          local_40 = dst;
          do {
            multiplier = 1;
            carry = 0;
            while ((*begin != 0x2e || (begin = begin + 1, begin != end))) {
              bVar1 = *begin;
              if (9 < (int)(char)bVar1 - 0x30U) {
                __assert_fail("decValue < 10U && \"Invalid character in significand\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0x9dc,
                              "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromDecimalString(StringRef, roundingMode)"
                             );
              }
              begin = begin + 1;
              multiplier = multiplier * 10;
              carry = (ulong)((int)(char)bVar1 - 0x30U) + carry * 10;
              if ((pbVar8 < begin) || (0x1999999999999998 < multiplier)) break;
            }
            APInt::tcMultiplyPart(dst,dst,multiplier,carry,uVar14,uVar14 + 1,false);
            pWVar3 = local_40;
            uVar4 = uVar14 + 1;
            if (dst[uVar14] == 0) {
              uVar4 = uVar14;
            }
            uVar14 = uVar4;
            if (pbVar8 < begin) {
              local_38->field_0x12 = local_38->field_0x12 & 0xf8 | 2;
              oVar5 = roundSignificandWithExponent(local_38,local_40,uVar14,local_48,local_44);
              operator_delete__(pWVar3);
              return oVar5;
            }
          } while( true );
        }
        goto LAB_00168493;
      }
    }
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    uVar14 = this->semantics->precision;
    if (uVar14 - 0x40 < 0xffffff80) {
      dst_00 = (Significand *)(this->significand).parts;
    }
    else {
      dst_00 = &this->significand;
    }
    APInt::tcSet(&dst_00->part,0,uVar14 + 0x40 >> 6);
    oVar5 = normalize(this,rounding_mode,lfLessThanHalf);
    return oVar5;
  }
LAB_00168493:
  oVar5 = handleOverflow(this,rounding_mode);
  return oVar5;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromDecimalString(StringRef str, roundingMode rounding_mode) {
  decimalInfo D;
  opStatus fs;

  /* Scan the text.  */
  StringRef::iterator p = str.begin();
  interpretDecimal(p, str.end(), &D);

  /* Handle the quick cases.  First the case of no significant digits,
     i.e. zero, and then exponents that are obviously too large or too
     small.  Writing L for log 10 / log 2, a number d.ddddd*10^exp
     definitely overflows if

           (exp - 1) * L >= maxExponent

     and definitely underflows to zero where

           (exp + 1) * L <= minExponent - precision

     With integer arithmetic the tightest bounds for L are

           93/28 < L < 196/59            [ numerator <= 256 ]
           42039/12655 < L < 28738/8651  [ numerator <= 65536 ]
  */

  // Test if we have a zero number allowing for strings with no null terminators
  // and zero decimals with non-zero exponents.
  //
  // We computed firstSigDigit by ignoring all zeros and dots. Thus if
  // D->firstSigDigit equals str.end(), every digit must be a zero and there can
  // be at most one dot. On the other hand, if we have a zero with a non-zero
  // exponent, then we know that D.firstSigDigit will be non-numeric.
  if (D.firstSigDigit == str.end() || decDigitValue(*D.firstSigDigit) >= 10U) {
    category = fcZero;
    fs = opOK;

  /* Check whether the normalized exponent is high enough to overflow
     max during the log-rebasing in the max-exponent check below. */
  } else if (D.normalizedExponent - 1 > INT_MAX / 42039) {
    fs = handleOverflow(rounding_mode);

  /* If it wasn't, then it also wasn't high enough to overflow max
     during the log-rebasing in the min-exponent check.  Check that it
     won't overflow min in either check, then perform the min-exponent
     check. */
  } else if (D.normalizedExponent - 1 < INT_MIN / 42039 ||
             (D.normalizedExponent + 1) * 28738 <=
               8651 * (semantics->minExponent - (int) semantics->precision)) {
    /* Underflow to zero and round.  */
    category = fcNormal;
    zeroSignificand();
    fs = normalize(rounding_mode, lfLessThanHalf);

  /* We can finally safely perform the max-exponent check. */
  } else if ((D.normalizedExponent - 1) * 42039
             >= 12655 * semantics->maxExponent) {
    /* Overflow and round.  */
    fs = handleOverflow(rounding_mode);
  } else {
    integerPart *decSignificand;
    unsigned int partCount;

    /* A tight upper bound on number of bits required to hold an
       N-digit decimal integer is N * 196 / 59.  Allocate enough space
       to hold the full significand, and an extra part required by
       tcMultiplyPart.  */
    partCount = static_cast<unsigned int>(D.lastSigDigit - D.firstSigDigit) + 1;
    partCount = partCountForBits(1 + 196 * partCount / 59);
    decSignificand = new integerPart[partCount + 1];
    partCount = 0;

    /* Convert to binary efficiently - we do almost all multiplication
       in an integerPart.  When this would overflow do we do a single
       bignum multiplication, and then revert again to multiplication
       in an integerPart.  */
    do {
      integerPart decValue, val, multiplier;

      val = 0;
      multiplier = 1;

      do {
        if (*p == '.') {
          p++;
          if (p == str.end()) {
            break;
          }
        }
        decValue = decDigitValue(*p++);
        assert(decValue < 10U && "Invalid character in significand");
        multiplier *= 10;
        val = val * 10 + decValue;
        /* The maximum number that can be multiplied by ten with any
           digit added without overflowing an integerPart.  */
      } while (p <= D.lastSigDigit && multiplier <= (~ (integerPart) 0 - 9) / 10);

      /* Multiply out the current part.  */
      APInt::tcMultiplyPart(decSignificand, decSignificand, multiplier, val,
                            partCount, partCount + 1, false);

      /* If we used another part (likely but not guaranteed), increase
         the count.  */
      if (decSignificand[partCount])
        partCount++;
    } while (p <= D.lastSigDigit);

    category = fcNormal;
    fs = roundSignificandWithExponent(decSignificand, partCount,
                                      D.exponent, rounding_mode);

    delete [] decSignificand;
  }

  return fs;
}